

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

bool __thiscall slang::ast::Type::isValidForDPIArg(Type *this)

{
  Type *pTVar1;
  SyntaxNode *pSVar2;
  bool bVar3;
  bool bVar4;
  Type *pTVar5;
  long lVar6;
  
  while( true ) {
    pTVar5 = this->canonical;
    if (pTVar5 == (Type *)0x0) {
      this->canonical = this;
      pTVar5 = this;
      do {
        pTVar5 = DeclaredType::getType((DeclaredType *)(pTVar5 + 1));
        this->canonical = pTVar5;
      } while ((pTVar5->super_Symbol).kind == TypeAlias);
    }
    bVar3 = isIntegral(pTVar5);
    bVar4 = true;
    if (bVar3) {
      return true;
    }
    bVar3 = isFloating(pTVar5);
    if (bVar3) {
      return true;
    }
    bVar3 = isString(pTVar5);
    if (bVar3) break;
    bVar3 = isCHandle(pTVar5);
    if (bVar3) {
      return true;
    }
    bVar3 = isVoid(pTVar5);
    if (bVar3) {
      return true;
    }
    if (((pTVar5->super_Symbol).kind | Definition) != DPIOpenArrayType) {
      bVar3 = isUnpackedStruct(pTVar5);
      if (bVar3) {
        pTVar1 = pTVar5[1].canonical;
        if (pTVar1 != (Type *)0x0) {
          pSVar2 = pTVar5[1].super_Symbol.originatingSyntax;
          lVar6 = 0;
          do {
            pTVar5 = DeclaredType::getType
                               ((DeclaredType *)(*(long *)((long)&pSVar2->kind + lVar6) + 0x40));
            bVar4 = isValidForDPIArg(pTVar5);
            if (!bVar4) {
              return bVar4;
            }
            bVar3 = (long)pTVar1 * 8 + -8 != lVar6;
            lVar6 = lVar6 + 8;
          } while (bVar3);
        }
      }
      else {
        bVar4 = false;
      }
      return bVar4;
    }
    this = getArrayElementType(pTVar5);
  }
  return true;
}

Assistant:

bool Type::isValidForDPIArg() const {
    auto& ct = getCanonicalType();
    if (ct.isIntegral() || ct.isFloating() || ct.isString() || ct.isCHandle() || ct.isVoid())
        return true;

    if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType ||
        ct.kind == SymbolKind::DPIOpenArrayType) {
        return ct.getArrayElementType()->isValidForDPIArg();
    }

    if (ct.isUnpackedStruct()) {
        for (auto field : ct.as<UnpackedStructType>().fields) {
            if (!field->getType().isValidForDPIArg())
                return false;
        }
        return true;
    }

    return false;
}